

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O3

void __thiscall wasm::CoalesceLocals::doWalkFunction(CoalesceLocals *this,Function *func)

{
  Expression *root;
  undefined1 auStack_28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  
  LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::doWalkFunction
            (&(this->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
              ).
              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
             ,func);
  increaseBackEdgePriorities(this);
  calculateInterferences(this);
  auStack_28 = (undefined1  [8])0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*(this->
    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
    ).super_Pass._vptr_Pass[9])(this);
  applyIndices(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_28,root);
  if (auStack_28 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_28,
                    (long)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_28);
  }
  return;
}

Assistant:

void CoalesceLocals::doWalkFunction(Function* func) {
  super::doWalkFunction(func);
  // prioritize back edges
  increaseBackEdgePriorities();
  // use liveness to find interference
  calculateInterferences();
  // pick new indices
  std::vector<Index> indices;
  pickIndices(indices);
  // apply indices
  applyIndices(indices, func->body);
}